

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl
          (LineTable *this,SectionedAddress Address,uint64_t Size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Result)

{
  uint uVar1;
  pointer pSVar2;
  iterator __position;
  bool bVar3;
  uint uVar4;
  uint32_t uVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pSVar10;
  pointer Seq;
  uint uVar11;
  SectionedAddress Address_00;
  undefined1 local_90 [8];
  Sequence Sequence;
  uint local_38;
  undefined4 local_34;
  
  uVar8 = Address.SectionIndex;
  uVar9 = Address.Address;
  if ((this->Sequences).
      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Sequences).
      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return false;
  }
  DWARFDebugLine::Sequence::Sequence((Sequence *)local_90);
  pSVar10 = (this->Sequences).
            super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->Sequences).
           super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)pSVar2 - (long)pSVar10;
  if (0 < (long)uVar6) {
    uVar7 = (uVar6 >> 3) * -0x3333333333333333;
    do {
      uVar6 = uVar7 >> 1;
      bVar3 = true;
      if (pSVar10[uVar6].SectionIndex <= uVar8) {
        if (pSVar10[uVar6].SectionIndex < uVar8) {
          bVar3 = false;
        }
        else {
          bVar3 = uVar9 < pSVar10[uVar6].HighPC;
        }
      }
      if (!bVar3) {
        pSVar10 = pSVar10 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar7;
      }
      uVar7 = uVar6;
    } while (0 < (long)uVar6);
  }
  if (pSVar10 != pSVar2) {
    local_34 = 0;
    if ((pSVar10->SectionIndex != uVar8) || (uVar9 < pSVar10->LowPC)) goto LAB_00d7d8ac;
    if (uVar9 < pSVar10->HighPC) {
      local_34 = (undefined4)CONCAT71((int7)(uVar6 >> 8),1);
      if (pSVar10 != pSVar2) {
        Sequence._32_8_ = (Size + uVar9) - 1;
        Seq = pSVar10;
        Sequence.LowPC = uVar9;
        Sequence.HighPC = uVar8;
        do {
          if (Size + uVar9 <= Seq->LowPC) break;
          if (Seq == pSVar10) {
            uVar11 = findRowInSeq(this,Seq,Address);
          }
          else {
            uVar11 = Seq->FirstRowIndex;
          }
          Address_00.SectionIndex = uVar8;
          Address_00.Address = Sequence._32_8_;
          uVar5 = findRowInSeq(this,Seq,Address_00);
          uVar1 = this->UnknownRowIndex;
          uVar4 = Seq->LastRowIndex - 1;
          if (uVar5 != uVar1) {
            uVar4 = uVar5;
          }
          if (uVar11 == uVar1) {
            __assert_fail("FirstRowIndex != UnknownRowIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                          ,0x3f4,
                          "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                         );
          }
          if (uVar4 == uVar1) {
            __assert_fail("LastRowIndex != UnknownRowIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                          ,0x3f5,
                          "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                         );
          }
          while (local_38 = uVar11, uVar11 <= uVar4) {
            __position._M_current =
                 (Result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (Result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)Result,__position,
                         &local_38);
            }
            else {
              *__position._M_current = uVar11;
              (Result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar11 = local_38 + 1;
          }
          Seq = Seq + 1;
        } while (Seq != pSVar2);
      }
      goto LAB_00d7d8ac;
    }
  }
  local_34 = 0;
LAB_00d7d8ac:
  return (bool)(undefined1)local_34;
}

Assistant:

bool DWARFDebugLine::LineTable::lookupAddressRangeImpl(
    object::SectionedAddress Address, uint64_t Size,
    std::vector<uint32_t> &Result) const {
  if (Sequences.empty())
    return false;
  uint64_t EndAddr = Address.Address + Size;
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter LastSeq = Sequences.end();
  SequenceIter SeqPos = llvm::upper_bound(
      Sequences, Sequence, DWARFDebugLine::Sequence::orderByHighPC);
  if (SeqPos == LastSeq || !SeqPos->containsPC(Address))
    return false;

  SequenceIter StartPos = SeqPos;

  // Add the rows from the first sequence to the vector, starting with the
  // index we just calculated

  while (SeqPos != LastSeq && SeqPos->LowPC < EndAddr) {
    const DWARFDebugLine::Sequence &CurSeq = *SeqPos;
    // For the first sequence, we need to find which row in the sequence is the
    // first in our range.
    uint32_t FirstRowIndex = CurSeq.FirstRowIndex;
    if (SeqPos == StartPos)
      FirstRowIndex = findRowInSeq(CurSeq, Address);

    // Figure out the last row in the range.
    uint32_t LastRowIndex =
        findRowInSeq(CurSeq, {EndAddr - 1, Address.SectionIndex});
    if (LastRowIndex == UnknownRowIndex)
      LastRowIndex = CurSeq.LastRowIndex - 1;

    assert(FirstRowIndex != UnknownRowIndex);
    assert(LastRowIndex != UnknownRowIndex);

    for (uint32_t I = FirstRowIndex; I <= LastRowIndex; ++I) {
      Result.push_back(I);
    }

    ++SeqPos;
  }

  return true;
}